

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void __thiscall
tcmalloc::LowLevelAlloc::Arena::InsertAllocatedMemoryLocked
          (Arena *this,void *new_pages,size_t new_pages_size)

{
  intptr_t iVar1;
  AllocList *s;
  size_t new_pages_size_local;
  void *new_pages_local;
  Arena *this_local;
  
  *(size_t *)new_pages = new_pages_size;
  iVar1 = Magic(0x4c833e95,(Header *)new_pages);
  *(intptr_t *)((long)new_pages + 8) = iVar1;
  *(Arena **)((long)new_pages + 0x10) = this;
  AddToFreelist((void *)((long)new_pages + 0x20),this);
  return;
}

Assistant:

void LowLevelAlloc::Arena::InsertAllocatedMemoryLocked(void *new_pages, size_t new_pages_size) {
  AllocList *s;
  s = reinterpret_cast<AllocList *>(new_pages);
  s->header.size = new_pages_size;
  // Pretend the block is allocated; call AddToFreelist() to free it.
  s->header.magic = Magic(kMagicAllocated, &s->header);
  s->header.arena = this;
  AddToFreelist(&s->levels, this);  // insert new region into free
}